

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Aig_Man_t * Abc_NtkToDarBmc(Abc_Ntk_t *pNtk,Vec_Int_t **pvMap)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *vSuper_00;
  Vec_Ptr_t *p;
  Vec_Int_t *pVVar3;
  void *Entry;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *p1;
  uint local_54;
  int local_50;
  int nDontCares;
  int k;
  int i;
  Vec_Ptr_t *vSuper;
  Vec_Ptr_t *vDrivers;
  Abc_Obj_t *pTemp;
  Abc_Obj_t *pObj;
  Aig_Man_t *pMan;
  Vec_Int_t **pvMap_local;
  Abc_Ntk_t *pNtk_local;
  
  local_54 = 0;
  for (nDontCares = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), nDontCares < iVar1;
      nDontCares = nDontCares + 1) {
    pAVar2 = Abc_NtkBox(pNtk,nDontCares);
    iVar1 = Abc_ObjIsLatch(pAVar2);
    if ((iVar1 != 0) && (iVar1 = Abc_LatchIsInitDc(pAVar2), iVar1 != 0)) {
      Abc_LatchSetInit0(pAVar2);
      local_54 = local_54 + 1;
    }
  }
  if (local_54 != 0) {
    Abc_Print(1,"Warning: %d registers in this network have don\'t-care init values.\n",
              (ulong)local_54);
    Abc_Print(1,"The don\'t-care are assumed to be 0. The result may not verify.\n");
    Abc_Print(1,"Use command \"print_latch\" to see the init values of registers.\n");
    Abc_Print(1,"Use command \"zero\" to convert or \"init\" to change the values.\n");
  }
  vSuper_00 = Vec_PtrAlloc(100);
  p = Vec_PtrAlloc(100);
  if (pvMap != (Vec_Int_t **)0x0) {
    pVVar3 = Vec_IntAlloc(100);
    *pvMap = pVVar3;
  }
  for (nDontCares = 0; iVar1 = Abc_NtkPoNum(pNtk), nDontCares < iVar1; nDontCares = nDontCares + 1)
  {
    pAVar2 = Abc_NtkPo(pNtk,nDontCares);
    if ((pNtk->nConstrs == 0) || (nDontCares < pNtk->nConstrs)) {
      pAVar2 = Abc_ObjChild0(pAVar2);
      Abc_CollectTopOr(pAVar2,vSuper_00);
      for (local_50 = 0; iVar1 = Vec_PtrSize(vSuper_00), local_50 < iVar1; local_50 = local_50 + 1)
      {
        Entry = Vec_PtrEntry(vSuper_00,local_50);
        Vec_PtrPush(p,Entry);
        if (pvMap != (Vec_Int_t **)0x0) {
          Vec_IntPush(*pvMap,nDontCares);
        }
      }
    }
    else {
      pAVar2 = Abc_ObjChild0(pAVar2);
      pAVar2 = Abc_ObjNot(pAVar2);
      Vec_PtrPush(p,pAVar2);
      if (pvMap != (Vec_Int_t **)0x0) {
        Vec_IntPush(*pvMap,nDontCares);
      }
    }
  }
  Vec_PtrFree(vSuper_00);
  iVar1 = Abc_NtkNodeNum(pNtk);
  pNtk_local = (Abc_Ntk_t *)Aig_ManStart(iVar1 + 100);
  ((Aig_Man_t *)pNtk_local)->nConstrs = pNtk->nConstrs;
  ((Aig_Man_t *)pNtk_local)->nBarBufs = pNtk->nBarBufs;
  pcVar4 = Extra_UtilStrsav(pNtk->pName);
  ((Aig_Man_t *)pNtk_local)->pName = pcVar4;
  pcVar4 = Extra_UtilStrsav(pNtk->pSpec);
  ((Aig_Man_t *)pNtk_local)->pSpec = pcVar4;
  pAVar2 = (Abc_Obj_t *)Aig_ManConst1((Aig_Man_t *)pNtk_local);
  pAVar5 = Abc_AigConst1(pNtk);
  (pAVar5->field_6).pCopy = pAVar2;
  for (nDontCares = 0; iVar1 = Abc_NtkCiNum(pNtk), nDontCares < iVar1; nDontCares = nDontCares + 1)
  {
    pAVar2 = Abc_NtkCi(pNtk,nDontCares);
    pAVar5 = (Abc_Obj_t *)Aig_ObjCreateCi((Aig_Man_t *)pNtk_local);
    (pAVar2->field_6).pCopy = pAVar5;
  }
  for (nDontCares = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), nDontCares < iVar1;
      nDontCares = nDontCares + 1) {
    pAVar2 = Abc_NtkBox(pNtk,nDontCares);
    iVar1 = Abc_ObjIsLatch(pAVar2);
    if (iVar1 != 0) {
      pAVar5 = Abc_ObjFanout0(pAVar2);
      pAVar5 = (pAVar5->field_6).pCopy;
      iVar1 = Abc_LatchIsInit1(pAVar2);
      pAVar5 = Abc_ObjNotCond(pAVar5,iVar1);
      pAVar2 = Abc_ObjFanout0(pAVar2);
      (pAVar2->field_6).pCopy = pAVar5;
    }
  }
  for (nDontCares = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), nDontCares < iVar1;
      nDontCares = nDontCares + 1) {
    pAVar2 = Abc_NtkObj(pNtk,nDontCares);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar2), iVar1 != 0)) {
      pAVar5 = Abc_ObjChild0Copy(pAVar2);
      p1 = Abc_ObjChild1Copy(pAVar2);
      pAVar5 = (Abc_Obj_t *)Aig_And((Aig_Man_t *)pNtk_local,(Aig_Obj_t *)pAVar5,(Aig_Obj_t *)p1);
      (pAVar2->field_6).pCopy = pAVar5;
    }
  }
  for (local_50 = 0; iVar1 = Vec_PtrSize(p), local_50 < iVar1; local_50 = local_50 + 1) {
    pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(p,local_50);
    pAVar2 = Abc_ObjRegular(pAVar5);
    pAVar2 = (pAVar2->field_6).pCopy;
    iVar1 = Abc_ObjIsComplement(pAVar5);
    pAVar2 = Abc_ObjNotCond(pAVar2,(uint)((iVar1 != 0 ^ 0xffU) & 1));
    Aig_ObjCreateCo((Aig_Man_t *)pNtk_local,(Aig_Obj_t *)pAVar2);
  }
  Vec_PtrFree(p);
  for (nDontCares = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), nDontCares < iVar1;
      nDontCares = nDontCares + 1) {
    pAVar2 = Abc_NtkBox(pNtk,nDontCares);
    iVar1 = Abc_ObjIsLatch(pAVar2);
    if (iVar1 != 0) {
      pAVar2 = Abc_NtkBox(pNtk,nDontCares);
      pAVar2 = Abc_ObjFanin0(pAVar2);
      pAVar5 = Abc_ObjChild0Copy(pAVar2);
      pAVar2 = Abc_ObjFanout0(pAVar2);
      iVar1 = Abc_LatchIsInit1(pAVar2);
      pAVar2 = Abc_ObjNotCond(pAVar5,iVar1);
      Aig_ObjCreateCo((Aig_Man_t *)pNtk_local,(Aig_Obj_t *)pAVar2);
    }
  }
  iVar1 = Abc_NtkLatchNum(pNtk);
  Aig_ManSetRegNum((Aig_Man_t *)pNtk_local,iVar1);
  Aig_ManCleanup((Aig_Man_t *)pNtk_local);
  iVar1 = Aig_ManCheck((Aig_Man_t *)pNtk_local);
  if (iVar1 == 0) {
    Abc_Print(1,"Abc_NtkToDarBmc: AIG check has failed.\n");
    Aig_ManStop((Aig_Man_t *)pNtk_local);
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  return (Aig_Man_t *)pNtk_local;
}

Assistant:

Aig_Man_t * Abc_NtkToDarBmc( Abc_Ntk_t * pNtk, Vec_Int_t ** pvMap )
{
    Aig_Man_t * pMan;
    Abc_Obj_t * pObj, * pTemp;
    Vec_Ptr_t * vDrivers;
    Vec_Ptr_t * vSuper;
    int i, k, nDontCares;

    // print warning about initial values
    nDontCares = 0;
    Abc_NtkForEachLatch( pNtk, pObj, i )
        if ( Abc_LatchIsInitDc(pObj) )
        {
            Abc_LatchSetInit0(pObj);
            nDontCares++;
        }
    if ( nDontCares )
    {
        Abc_Print( 1, "Warning: %d registers in this network have don't-care init values.\n", nDontCares );
        Abc_Print( 1, "The don't-care are assumed to be 0. The result may not verify.\n" );
        Abc_Print( 1, "Use command \"print_latch\" to see the init values of registers.\n" );
        Abc_Print( 1, "Use command \"zero\" to convert or \"init\" to change the values.\n" );
    }

    // collect the drivers
    vSuper   = Vec_PtrAlloc( 100 );
    vDrivers = Vec_PtrAlloc( 100 );
    if ( pvMap ) 
    *pvMap   = Vec_IntAlloc( 100 );
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if ( pNtk->nConstrs && i >= pNtk->nConstrs )
        {
            Vec_PtrPush( vDrivers, Abc_ObjNot(Abc_ObjChild0(pObj)) );
            if ( pvMap )
            Vec_IntPush( *pvMap, i );
            continue;
        }
        Abc_CollectTopOr( Abc_ObjChild0(pObj), vSuper );
        Vec_PtrForEachEntry( Abc_Obj_t *, vSuper, pTemp, k )
        {
            Vec_PtrPush( vDrivers, pTemp );
            if ( pvMap )
            Vec_IntPush( *pvMap, i );
        }       
    }
    Vec_PtrFree( vSuper );

    // create network
    pMan = Aig_ManStart( Abc_NtkNodeNum(pNtk) + 100 );
    pMan->nConstrs = pNtk->nConstrs;
    pMan->nBarBufs = pNtk->nBarBufs;
    pMan->pName = Extra_UtilStrsav( pNtk->pName );
    pMan->pSpec = Extra_UtilStrsav( pNtk->pSpec );
    // transfer the pointers to the basic nodes
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)Aig_ManConst1(pMan);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Aig_ObjCreateCi(pMan);
    // create flops
    Abc_NtkForEachLatch( pNtk, pObj, i )
        Abc_ObjFanout0(pObj)->pCopy = Abc_ObjNotCond( Abc_ObjFanout0(pObj)->pCopy, Abc_LatchIsInit1(pObj) );
    // copy internal nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Aig_And( pMan, (Aig_Obj_t *)Abc_ObjChild0Copy(pObj), (Aig_Obj_t *)Abc_ObjChild1Copy(pObj) );
    // create the POs
    Vec_PtrForEachEntry( Abc_Obj_t *, vDrivers, pTemp, k )
        Aig_ObjCreateCo( pMan, (Aig_Obj_t *)Abc_ObjNotCond(Abc_ObjRegular(pTemp)->pCopy, !Abc_ObjIsComplement(pTemp)) );
    Vec_PtrFree( vDrivers );
    // create flops
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
        Aig_ObjCreateCo( pMan, (Aig_Obj_t *)Abc_ObjNotCond(Abc_ObjChild0Copy(pObj), Abc_LatchIsInit1(Abc_ObjFanout0(pObj))) );

    // remove dangling nodes
    Aig_ManSetRegNum( pMan, Abc_NtkLatchNum(pNtk) );
    Aig_ManCleanup( pMan );
    if ( !Aig_ManCheck( pMan ) )
    {
        Abc_Print( 1, "Abc_NtkToDarBmc: AIG check has failed.\n" );
        Aig_ManStop( pMan );
        return NULL;
    }
    return pMan;
}